

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarScrollingButtons(ImGuiTabBar *tab_bar)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImVec2 size;
  ImVec2 size_00;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiTabItem *tab;
  float fVar6;
  ImGuiTabItem *local_d0;
  int local_c4;
  int local_b0;
  int local_ac;
  int target_order;
  int selected_order;
  ImGuiTabItem *tab_item;
  ImGuiTabItem *tab_to_scroll_to;
  ImVec2 local_90 [2];
  ImVec2 local_7c;
  float local_74;
  float local_70;
  float x;
  float backup_repeat_rate;
  float backup_repeat_delay;
  undefined1 auStack_58 [8];
  ImVec4 arrow_col;
  int local_3c;
  int select_dir;
  ImVec2 backup_cursor_pos;
  float fStack_28;
  float scrolling_buttons_width;
  ImVec2 arrow_button_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *tab_bar_local;
  
  pIVar4 = GImGui;
  arrow_button_size = (ImVec2)GImGui->CurrentWindow;
  fVar6 = (GImGui->Style).FramePadding.y;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,GImGui->FontSize + -2.0,
                 fVar6 + fVar6 + GImGui->FontSize);
  fVar6 = fStack_28 + fStack_28;
  uVar1 = *(undefined8 *)((long)arrow_button_size + 0xd8);
  local_3c = 0;
  auStack_58._0_4_ = (pIVar4->Style).Colors[0].x;
  auStack_58._4_4_ = (pIVar4->Style).Colors[0].y;
  uVar2 = (pIVar4->Style).Colors[0].z;
  uVar3 = (pIVar4->Style).Colors[0].w;
  arrow_col.y = (float)uVar3 * 0.5;
  arrow_col.x = (float)uVar2;
  PushStyleColor(0,(ImVec4 *)auStack_58);
  ImVec4::ImVec4((ImVec4 *)&backup_repeat_rate,0.0,0.0,0.0,0.0);
  PushStyleColor(0x15,(ImVec4 *)&backup_repeat_rate);
  x = (pIVar4->IO).KeyRepeatDelay;
  local_70 = (pIVar4->IO).KeyRepeatRate;
  (pIVar4->IO).KeyRepeatDelay = 0.25;
  (pIVar4->IO).KeyRepeatRate = 0.2;
  local_74 = ImMax<float>((tab_bar->BarRect).Min.x,(tab_bar->BarRect).Max.x - fVar6);
  ImVec2::ImVec2(&local_7c,local_74,(tab_bar->BarRect).Min.y);
  *(ImVec2 *)((long)arrow_button_size + 0xd8) = local_7c;
  size.y = scrolling_buttons_width;
  size.x = fStack_28;
  bVar5 = ArrowButtonEx("##<",0,size,0x410);
  if (bVar5) {
    local_3c = -1;
  }
  ImVec2::ImVec2(local_90,local_74 + fStack_28,(tab_bar->BarRect).Min.y);
  *(ImVec2 *)((long)arrow_button_size + 0xd8) = local_90[0];
  size_00.y = scrolling_buttons_width;
  size_00.x = fStack_28;
  bVar5 = ArrowButtonEx("##>",1,size_00,0x410);
  if (bVar5) {
    local_3c = 1;
  }
  PopStyleColor(2);
  (pIVar4->IO).KeyRepeatRate = local_70;
  (pIVar4->IO).KeyRepeatDelay = x;
  tab_item = (ImGuiTabItem *)0x0;
  if ((local_3c != 0) &&
     (tab = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), tab != (ImGuiTabItem *)0x0)) {
    local_ac = ImGuiTabBar::GetTabOrder(tab_bar,tab);
    local_b0 = local_ac + local_3c;
    while (tab_item == (ImGuiTabItem *)0x0) {
      if ((local_b0 < 0) || ((tab_bar->Tabs).Size <= local_b0)) {
        local_c4 = local_ac;
      }
      else {
        local_c4 = local_b0;
      }
      local_d0 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,local_c4);
      tab_item = local_d0;
      if ((local_d0->Flags & 0x200000U) != 0) {
        local_b0 = local_3c + local_b0;
        local_ac = local_3c + local_ac;
        if ((-1 < local_b0) && (local_b0 < (tab_bar->Tabs).Size)) {
          local_d0 = (ImGuiTabItem *)0x0;
        }
        tab_item = local_d0;
      }
    }
  }
  *(undefined8 *)((long)arrow_button_size + 0xd8) = uVar1;
  (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar6 + 1.0);
  return tab_item;
}

Assistant:

static ImGuiTabItem* ImGui::TabBarScrollingButtons(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImVec2 arrow_button_size(g.FontSize - 2.0f, g.FontSize + g.Style.FramePadding.y * 2.0f);
    const float scrolling_buttons_width = arrow_button_size.x * 2.0f;

    const ImVec2 backup_cursor_pos = window->DC.CursorPos;
    //window->DrawList->AddRect(ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width, tab_bar->BarRect.Min.y), ImVec2(tab_bar->BarRect.Max.x, tab_bar->BarRect.Max.y), IM_COL32(255,0,0,255));

    int select_dir = 0;
    ImVec4 arrow_col = g.Style.Colors[ImGuiCol_Text];
    arrow_col.w *= 0.5f;

    PushStyleColor(ImGuiCol_Text, arrow_col);
    PushStyleColor(ImGuiCol_Button, ImVec4(0, 0, 0, 0));
    const float backup_repeat_delay = g.IO.KeyRepeatDelay;
    const float backup_repeat_rate = g.IO.KeyRepeatRate;
    g.IO.KeyRepeatDelay = 0.250f;
    g.IO.KeyRepeatRate = 0.200f;
    float x = ImMax(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.x - scrolling_buttons_width);
    window->DC.CursorPos = ImVec2(x, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##<", ImGuiDir_Left, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = -1;
    window->DC.CursorPos = ImVec2(x + arrow_button_size.x, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##>", ImGuiDir_Right, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = +1;
    PopStyleColor(2);
    g.IO.KeyRepeatRate = backup_repeat_rate;
    g.IO.KeyRepeatDelay = backup_repeat_delay;

    ImGuiTabItem* tab_to_scroll_to = NULL;
    if (select_dir != 0)
        if (ImGuiTabItem* tab_item = TabBarFindTabByID(tab_bar, tab_bar->SelectedTabId))
        {
            int selected_order = tab_bar->GetTabOrder(tab_item);
            int target_order = selected_order + select_dir;

            // Skip tab item buttons until another tab item is found or end is reached
            while (tab_to_scroll_to == NULL)
            {
                // If we are at the end of the list, still scroll to make our tab visible
                tab_to_scroll_to = &tab_bar->Tabs[(target_order >= 0 && target_order < tab_bar->Tabs.Size) ? target_order : selected_order];

                // Cross through buttons
                // (even if first/last item is a button, return it so we can update the scroll)
                if (tab_to_scroll_to->Flags & ImGuiTabItemFlags_Button)
                {
                    target_order += select_dir;
                    selected_order += select_dir;
                    tab_to_scroll_to = (target_order < 0 || target_order >= tab_bar->Tabs.Size) ? tab_to_scroll_to : NULL;
                }
            }
        }
    window->DC.CursorPos = backup_cursor_pos;
    tab_bar->BarRect.Max.x -= scrolling_buttons_width + 1.0f;

    return tab_to_scroll_to;
}